

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
::TestBody(InsertHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  anon_union_8_1_a8a14541_for_iterator_1 *this_00;
  iterator i;
  const_iterator cVar1;
  iterator i_00;
  const_iterator cVar2;
  bool bVar3;
  char *pcVar4;
  reference ppVar5;
  char *in_R9;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar6;
  AssertHelper local_9b0;
  Message local_9a8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_970;
  Message local_968;
  iterator local_960;
  bool local_929;
  undefined1 local_928 [8];
  AssertionResult gtest_ar__1;
  const_iterator local_8e8;
  iterator local_8b8;
  Generator<int,_void> local_885;
  int local_884;
  undefined1 local_880 [8];
  T val2;
  Message local_868;
  undefined1 local_860 [8];
  AssertionResult gtest_ar;
  AssertHelper local_830;
  Message local_828;
  iterator local_820;
  bool local_7e9;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_;
  iterator local_7c8;
  const_iterator local_798;
  undefined1 auStack_768 [8];
  iterator it;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> local_21;
  undefined1 local_20 [8];
  T val;
  InsertHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
  *this_local;
  
  val._8_8_ = this;
  pVar6 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_21);
  local_20 = (undefined1  [8])pVar6.first;
  val.first._0_4_ = pVar6.second;
  this_00 = &it.it_end_.field_1;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)this_00);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::end(&local_7c8,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
         *)this_00);
  i.inner_end_ = local_7c8.inner_end_;
  i.inner_ = local_7c8.inner_;
  i.it_.ctrl_ = local_7c8.it_.ctrl_;
  i.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_7c8.it_.field_1.slot_;
  i.it_end_.ctrl_ = local_7c8.it_end_.ctrl_;
  i.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_7c8.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::const_iterator::const_iterator(&local_798,i);
  cVar1.iter_.inner_end_ = local_798.iter_.inner_end_;
  cVar1.iter_.inner_ = local_798.iter_.inner_;
  cVar1.iter_.it_.ctrl_ = local_798.iter_.it_.ctrl_;
  cVar1.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_798.iter_.it_.field_1.slot_;
  cVar1.iter_.it_end_.ctrl_ = local_798.iter_.it_end_.ctrl_;
  cVar1.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_798.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::insert<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_0,_0>
            ((iterator *)auStack_768,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
              *)&it.it_end_.field_1,cVar1,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_20);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::end(&local_820,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
         *)&it.it_end_.field_1);
  local_7e9 = priv::operator!=((iterator *)auStack_768,&local_820);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7e8,&local_7e9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar3) {
    testing::Message::Message(&local_828);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_7e8,(AssertionResult *)"it != m.end()"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  ppVar5 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ::iterator::operator*((iterator *)auStack_768);
  testing::internal::EqHelper::
  Compare<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_nullptr>
            ((EqHelper *)local_860,"val","*it",
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_20,ppVar5);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar3) {
    testing::Message::Message(&local_868);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&val2.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&val2.second,&local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&val2.second);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  local_884 = hash_internal::Generator<int,_void>::operator()(&local_885);
  std::pair<const_phmap::priv::hash_internal::EnumClass,_int>::pair<int,_true>
            ((pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_880,
             (EnumClass *)local_20,&local_884);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_768;
  i_00.inner_end_ = it.inner_;
  i_00.inner_ = (Inner *)auStack_768;
  i_00.it_.ctrl_ = (ctrl_t *)it.inner_end_;
  i_00.it_.field_1.slot_ = (slot_type *)it.it_.ctrl_;
  i_00.it_end_.ctrl_ = (ctrl_t *)it.it_.field_1.slot_;
  i_00.it_end_.field_1.slot_ = (slot_type *)it.it_end_.ctrl_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::const_iterator::const_iterator(&local_8e8,i_00);
  cVar2.iter_.inner_end_ = local_8e8.iter_.inner_end_;
  cVar2.iter_.inner_ = local_8e8.iter_.inner_;
  cVar2.iter_.it_.ctrl_ = local_8e8.iter_.it_.ctrl_;
  cVar2.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_8e8.iter_.it_.field_1.slot_;
  cVar2.iter_.it_end_.ctrl_ = local_8e8.iter_.it_end_.ctrl_;
  cVar2.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_8e8.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::insert<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_0,_0>
            (&local_8b8,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
              *)&it.it_end_.field_1,cVar2,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_880);
  it.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_8b8.it_end_.ctrl_;
  it.it_end_.ctrl_ = (ctrl_t *)local_8b8.it_end_.field_1.slot_;
  it.inner_end_ = (Inner *)local_8b8.it_.ctrl_;
  it.it_.ctrl_ = (ctrl_t *)local_8b8.it_.field_1.slot_;
  auStack_768 = (undefined1  [8])local_8b8.inner_;
  it.inner_ = local_8b8.inner_end_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::end(&local_960,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
         *)&it.it_end_.field_1);
  local_929 = priv::operator!=((iterator *)auStack_768,&local_960);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_928,&local_929,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar3) {
    testing::Message::Message(&local_968);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_928,
               (AssertionResult *)"it != m.end()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  ppVar5 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ::iterator::operator*((iterator *)auStack_768);
  testing::internal::EqHelper::
  Compare<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_nullptr>
            ((EqHelper *)local_9a0,"val","*it",
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_20,ppVar5);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar3) {
    testing::Message::Message(&local_9a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9b0);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)&it.it_end_.field_1);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}